

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::panic(torrent *this)

{
  bool bVar1;
  pointer this_00;
  torrent *this_local;
  
  storage_holder::reset(&this->m_storage);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    peer_list::clear(this_00);
  }
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  clear(&(this->super_torrent_hot_members).m_connections.
         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       );
  ::std::
  set<libtorrent::digest32<160L>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
  ::clear(&this->m_outgoing_pids);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::clear(&this->m_peers_to_disconnect);
  *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xff000000;
  this->m_num_connecting = 0;
  this->m_num_connecting_seeds = 0;
  return;
}

Assistant:

void torrent::panic()
	{
		m_storage.reset();
		// if there are any other peers allocated still, we need to clear them
		// now. They can't be cleared later because the allocator will already
		// have been destructed
		if (m_peer_list) m_peer_list->clear();
		m_connections.clear();
		m_outgoing_pids.clear();
		m_peers_to_disconnect.clear();
		m_num_uploads = 0;
		m_num_connecting = 0;
		m_num_connecting_seeds = 0;
	}